

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O0

void __thiscall cmXMLWriter::StartDocument(cmXMLWriter *this,char *encoding)

{
  ostream *poVar1;
  char *encoding_local;
  cmXMLWriter *this_local;
  
  poVar1 = std::operator<<(this->Output,"<?xml version=\"1.0\" encoding=\"");
  poVar1 = std::operator<<(poVar1,encoding);
  std::operator<<(poVar1,"\"?>");
  return;
}

Assistant:

void cmXMLWriter::StartDocument(const char* encoding)
{
  this->Output << R"(<?xml version="1.0" encoding=")" << encoding << "\"?>";
}